

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QWidget * __thiscall QMainWindowLayout::getSeparatorWidget(QMainWindowLayout *this)

{
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QWidget *parent;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QSet<QWidget_*> aQStack_38 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x758) == 0) {
    this_00.m_data = operator_new(0x28);
    parent = QLayout::parentWidget((QLayout *)this);
    QWidget::QWidget((QWidget *)this_00.m_data,parent,(WindowFlags)0x0);
    QWidget::setAttribute((QWidget *)this_00.m_data,WA_MouseNoMask,true);
    QWidget::setAutoFillBackground((QWidget *)this_00.m_data,false);
    QVar1.m_size = (size_t)"qt_qmainwindow_extended_splitter";
    QVar1.field_0.m_data = this_00.m_data;
    QObject::setObjectName(QVar1);
  }
  else {
    this_00.m_data = QList<QWidget_*>::takeLast((QList<QWidget_*> *)(this + 0x748));
  }
  local_28 = this_00;
  QSet<QWidget_*>::insert(aQStack_38,(QWidget **)(this + 0x740));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QWidget *)local_28.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QMainWindowLayout::getSeparatorWidget()
{
    QWidget *result = nullptr;
    if (!unusedSeparatorWidgets.isEmpty()) {
        result = unusedSeparatorWidgets.takeLast();
    } else {
        result = new QWidget(parentWidget());
        result->setAttribute(Qt::WA_MouseNoMask, true);
        result->setAutoFillBackground(false);
        result->setObjectName("qt_qmainwindow_extended_splitter"_L1);
    }
    usedSeparatorWidgets.insert(result);
    return result;
}